

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O0

int __thiscall UEFIFind::init(UEFIFind *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  USTATUS result;
  undefined1 local_40 [8];
  UByteArray buffer;
  CBString *path_local;
  UEFIFind *this_local;
  
  buffer.d.field_2._8_8_ = ctx;
  UByteArray::UByteArray((UByteArray *)local_40);
  bVar1 = readFileIntoBuffer((CBString *)buffer.d.field_2._8_8_,(UByteArray *)local_40);
  if (bVar1) {
    this_local = (UEFIFind *)FfsParser::parse(this->ffsParser,(UByteArray *)local_40);
    if (this_local == (UEFIFind *)0x0) {
      this->initDone = true;
      this_local = (UEFIFind *)0x0;
    }
  }
  else {
    this_local = (UEFIFind *)0x5;
  }
  UByteArray::~UByteArray((UByteArray *)local_40);
  return (int)this_local;
}

Assistant:

USTATUS UEFIFind::init(const UString & path)
{
    UByteArray buffer;
    if (false == readFileIntoBuffer(path, buffer))
        return U_FILE_OPEN;

    USTATUS result = ffsParser->parse(buffer);
    if (result)
        return result;

    initDone = true;
    return U_SUCCESS;
}